

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O1

void * __thiscall Centaurus::Stage2Runner::acquire_bank(Stage2Runner *this)

{
  int *piVar1;
  void *pvVar2;
  TransferListener p_Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  void *in_RCX;
  long lVar7;
  bool bVar8;
  
  sem_wait((sem_t *)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_slave_lock);
  pvVar2 = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window;
  do {
    iVar5 = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num;
    bVar4 = 0 < iVar5;
    if (0 < iVar5) {
      lVar7 = 0;
      do {
        piVar1 = (int *)((long)pvVar2 + lVar7 * 8 + 4);
        LOCK();
        iVar5 = *piVar1;
        bVar8 = iVar5 == 2;
        if (bVar8) {
          *piVar1 = 3;
          iVar5 = 2;
        }
        UNLOCK();
        if (bVar8) {
          p_Var3 = (this->super_NonRecursiveReductionRunner).m_xferlistener;
          if (p_Var3 != (TransferListener)0x0) {
            (*p_Var3)(-1,*(int *)((long)pvVar2 + lVar7 * 8),
                      (this->super_NonRecursiveReductionRunner).m_listener_context);
          }
          this->m_current_bank = (int)lVar7;
          bVar8 = false;
          in_RCX = (void *)((this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_size *
                            lVar7 + (long)(this->super_NonRecursiveReductionRunner).super_BaseRunner
                                          .m_main_window);
        }
        else {
          bVar8 = iVar5 != 6;
          if (!bVar8) {
            in_RCX = (void *)0x0;
          }
        }
        if (!bVar8) break;
        lVar7 = lVar7 + 1;
        lVar6 = (long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num;
        bVar4 = lVar7 < lVar6;
      } while (lVar7 < lVar6);
    }
    if (bVar4) {
      return in_RCX;
    }
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    wait_on_semaphore();
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Stage1_Unlocked;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage2_Locked)) {
          invoke_transfer_listener(-1, banks[i].number);
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        } else {
          if (old_state == WindowBankState::YouAreDone) {
            return NULL;
          }
        }
      }
    }
  }